

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::createGarbageSubdivMesh
          (SceneGraph *this,int hash,size_t numFaces,bool mblur,
          Ref<embree::SceneGraph::MaterialNode> *material)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer pvVar3;
  Vec3fa *pVVar4;
  undefined8 uVar5;
  Node *pNVar6;
  uint uVar7;
  int iVar8;
  SubdivMeshNode *this_00;
  Vec3fa *pVVar9;
  long lVar10;
  size_t sVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  uint f;
  Ref<embree::SceneGraph::MaterialNode> local_70;
  uint local_64;
  Node *local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_58;
  size_t local_50;
  size_t local_48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_40;
  ulong local_38;
  
  local_60 = (Node *)this;
  local_50 = numFaces;
  this_00 = (SubdivMeshNode *)::operator_new(0x1b0);
  local_70 = (Ref<embree::SceneGraph::MaterialNode>)material->ptr;
  if (local_70.ptr != (MaterialNode *)0x0) {
    (*((local_70.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  SubdivMeshNode::SubdivMeshNode(this_00,&local_70,(BBox1f)0x3f80000000000000,(ulong)mblur + 1);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  if (local_70.ptr != (MaterialNode *)0x0) {
    (*((local_70.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  uVar7 = (uint)(hash * -0x3361d2af) >> 0x11 | hash * 0x16a88000;
  uVar7 = (uVar7 * -0x194da000 | uVar7 * 0x1b873593 >> 0x13) * 5 + 0xe6546b64;
  uVar7 = (uVar7 >> 0x10 ^ uVar7) * -0x7a143595;
  uVar7 = (uVar7 >> 0xd ^ uVar7) * -0x3d4d51cb;
  uVar7 = uVar7 >> 0x10 ^ uVar7;
  local_58 = &this_00->verticesPerFace;
  local_40 = &this_00->position_indices;
  sVar11 = 0;
  while (pNVar6 = local_60, sVar11 != local_50) {
    uVar7 = uVar7 * 0x19660d + 0x3c6ef35f;
    f = (uVar7 >> 1) % 0x14;
    local_48 = sVar11;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(local_58,&f);
    uVar13 = 0;
    while (uVar13 < f) {
      uVar17 = uVar7 * 0x19660d + 0x3c6ef35f;
      if ((uVar17 & 0x3e) == 0) {
        uVar17 = uVar17 * 0x19660d + 0x3c6ef35f;
        local_64 = uVar17;
      }
      else {
        local_64 = (uint)((this_00->positions).
                          super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->size_active;
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (local_40,&local_64);
      pvVar3 = (this_00->positions).
               super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar11 = pvVar3->size_active;
      uVar18 = pvVar3->size_alloced;
      uVar14 = sVar11 + 1;
      local_38 = uVar13;
      if (uVar18 < uVar14) {
        uVar13 = uVar18;
        uVar16 = uVar14;
        if (uVar18 != 0) {
          for (; uVar16 = uVar13, uVar13 < uVar14; uVar13 = uVar13 * 2 + (ulong)(uVar13 * 2 == 0)) {
          }
        }
        if (uVar18 != uVar16) {
          pVVar4 = pvVar3->items;
          pVVar9 = (Vec3fa *)alignedMalloc(uVar16 << 4,0x10);
          pvVar3->items = pVVar9;
          lVar10 = 0;
          for (uVar13 = 0; uVar13 < pvVar3->size_active; uVar13 = uVar13 + 1) {
            puVar2 = (undefined8 *)((long)&pVVar4->field_0 + lVar10);
            uVar5 = puVar2[1];
            puVar1 = (undefined8 *)((long)&pvVar3->items->field_0 + lVar10);
            *puVar1 = *puVar2;
            puVar1[1] = uVar5;
            lVar10 = lVar10 + 0x10;
          }
          alignedFree(pVVar4);
          pvVar3->size_active = sVar11;
          pvVar3->size_alloced = uVar16;
        }
      }
      uVar7 = uVar17 * 0x979e791 + 0xaaf95334;
      pVVar4 = pvVar3->items;
      pvVar3->size_active = uVar14;
      *(ulong *)&pVVar4[sVar11].field_0 =
           CONCAT44(uVar17 * 0x17385ca9 + 0x47502932,uVar17 * 0x19660d + 0x3c6ef35f);
      *(ulong *)((long)&pVVar4[sVar11].field_0 + 8) =
           CONCAT44(uVar7,uVar17 * -0x50b6f56b + -0x2e330917);
      if (mblur) {
        pvVar3 = (this_00->positions).
                 super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        sVar11 = pvVar3[1].size_active;
        uVar14 = pvVar3[1].size_alloced;
        uVar13 = sVar11 + 1;
        if (uVar14 < uVar13) {
          uVar18 = uVar14;
          uVar16 = uVar13;
          if (uVar14 != 0) {
            for (; uVar16 = uVar18, uVar18 < uVar13; uVar18 = uVar18 * 2 + (ulong)(uVar18 * 2 == 0))
            {
            }
          }
          if (uVar14 != uVar16) {
            pVVar4 = pvVar3[1].items;
            pVVar9 = (Vec3fa *)alignedMalloc(uVar16 << 4,0x10);
            pvVar3[1].items = pVVar9;
            lVar10 = 0;
            for (uVar14 = 0; uVar14 < pvVar3[1].size_active; uVar14 = uVar14 + 1) {
              puVar2 = (undefined8 *)((long)&pVVar4->field_0 + lVar10);
              uVar5 = puVar2[1];
              puVar1 = (undefined8 *)((long)&(pvVar3[1].items)->field_0 + lVar10);
              *puVar1 = *puVar2;
              puVar1[1] = uVar5;
              lVar10 = lVar10 + 0x10;
            }
            alignedFree(pVVar4);
            pvVar3[1].size_active = sVar11;
            pvVar3[1].size_alloced = uVar16;
          }
        }
        iVar8 = uVar7 * 0x19660d;
        iVar12 = uVar7 * 0x17385ca9;
        iVar15 = uVar7 * -0x50b6f56b;
        uVar7 = uVar7 * 0x979e791 + 0xaaf95334;
        pVVar4 = pvVar3[1].items;
        pvVar3[1].size_active = uVar13;
        *(ulong *)&pVVar4[sVar11].field_0 = CONCAT44(iVar12 + 0x47502932,iVar8 + 0x3c6ef35f);
        *(ulong *)((long)&pVVar4[sVar11].field_0 + 8) = CONCAT44(uVar7,iVar15 + -0x2e330917);
      }
      uVar13 = local_38 + 1;
    }
    sVar11 = local_48 + 1;
  }
  (local_60->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
  return (Ref<embree::SceneGraph::Node>)pNVar6;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createGarbageSubdivMesh (int hash, size_t numFaces, bool mblur, Ref<MaterialNode> material)
  {
    RandomSampler sampler;
    RandomSampler_init(sampler,hash);
    Ref<SceneGraph::SubdivMeshNode> mesh = new SceneGraph::SubdivMeshNode(material,BBox1f(0,1),mblur?2:1);

    for (size_t i=0; i<numFaces; i++) 
    {
      const unsigned f = RandomSampler_getInt(sampler) % 20;
      mesh->verticesPerFace.push_back(f);
      for (size_t j=0; j<f; j++) 
      {
        mesh->position_indices.push_back((RandomSampler_getInt(sampler) % 32 == 0) ? RandomSampler_getUInt(sampler) : unsigned(mesh->numPositions()));

        const float x = cast_i2f(RandomSampler_getUInt(sampler));
        const float y = cast_i2f(RandomSampler_getUInt(sampler));
        const float z = cast_i2f(RandomSampler_getUInt(sampler));
        const float w = cast_i2f(RandomSampler_getUInt(sampler));
        mesh->positions[0].push_back(Vec3fa(Vec3ff(x,y,z,w)));

        if (mblur) 
        {
          const float x = cast_i2f(RandomSampler_getUInt(sampler));
          const float y = cast_i2f(RandomSampler_getUInt(sampler));
          const float z = cast_i2f(RandomSampler_getUInt(sampler));
          const float w = cast_i2f(RandomSampler_getUInt(sampler));
          mesh->positions[1].push_back(Vec3fa(Vec3ff(x,y,z,w)));
        }
      }
    }

    return mesh.dynamicCast<SceneGraph::Node>();
  }